

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char __thiscall Fl_Preferences::Node::deleteEntry(Node *this,char *name)

{
  uint uVar1;
  
  uVar1 = getEntry(this,name);
  if (uVar1 != 0xffffffff) {
    memmove(this->entry_ + (int)uVar1,this->entry_ + (long)(int)uVar1 + 1,
            (long)(int)(~uVar1 + this->nEntry_) << 4);
    this->nEntry_ = this->nEntry_ + -1;
    this->field_0x30 = this->field_0x30 | 1;
  }
  return uVar1 != 0xffffffff;
}

Assistant:

char Fl_Preferences::Node::deleteEntry( const char *name ) {
  int ix = getEntry( name );
  if ( ix == -1 ) return 0;
  memmove( entry_+ix, entry_+ix+1, (nEntry_-ix-1) * sizeof(Entry) );
  nEntry_--;
  dirty_ = 1;
  return 1;
}